

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::computeDuObj(HModel *this,int phase)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  int i;
  undefined4 local_10;
  
  *(undefined8 *)(in_RDI + 0x590) = 0;
  for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x614); local_10 = local_10 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)local_10);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x828),(long)local_10
                         );
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),(long)local_10
                         );
      *(double *)(in_RDI + 0x590) = dVar1 * *pvVar3 + *(double *)(in_RDI + 0x590);
    }
  }
  if (in_ESI != 1) {
    *(double *)(in_RDI + 0x590) = *(double *)(in_RDI + 0x590) - *(double *)(in_RDI + 0x620);
  }
  return;
}

Assistant:

void HModel::computeDuObj(int phase) {
    objective = 0;
    for (int i = 0; i < numTot; i++)
        if (nonbasicFlag[i]) objective += workValue[i] * workDual[i];
//    double sv_objective = objective;
    if (phase != 1) objective -= objOffset;
//    printf("Phase %1d: sv_objective = %g; objOffset = %g; Objective = %g\n", phase, sv_objective, objOffset, objective);
}